

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CHog.h
# Opt level: O0

void __thiscall CHog::getFeatVect(CHog *this,double *featVect,int x,int y,int w,int h)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  ulong uVar4;
  int local_38;
  int local_34;
  int j;
  int i;
  int dy;
  int dx;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  double *featVect_local;
  CHog *this_local;
  
  iVar2 = x + 1;
  iVar3 = y + 1;
  _y_local = featVect;
  if (featVect == (double *)0x0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(w * h * this->hist[iVar3][iVar2].dim);
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    _y_local = (double *)operator_new__(uVar4);
  }
  for (local_34 = 0; local_34 < h; local_34 = local_34 + 1) {
    if (iVar3 + local_34 < this->histSizeY) {
      j = local_34;
    }
    else {
      j = (this->histSizeY - iVar3) + -1;
    }
    for (local_38 = 0; local_38 < w; local_38 = local_38 + 1) {
      if (iVar2 + local_38 < this->histSizeX) {
        i = local_38;
      }
      else {
        i = (this->histSizeX - iVar2) + -1;
      }
      memcpy(_y_local + (local_34 * w + local_38) * this->hist[iVar3 + j][iVar2 + i].dim,
             this->hist[iVar3 + j][iVar2 + i].feat,(long)this->hist[iVar3 + j][iVar2 + i].dim << 3);
    }
  }
  return;
}

Assistant:

void CHog::getFeatVect(double* featVect, int x, int y, int w, int h)
{
	//cout << "getting feature vector" << endl;
    x += 1;
    y += 1;
    int dx, dy;
    if(featVect==NULL)
        featVect = new double[w*h*hist[y][x].dim];
    for(int i=0; i<h; i++)
    {
        if(y+i>=histSizeY)
            dy = histSizeY-y-1;
        else
            dy = i;
        for(int j=0; j<w; j++)
        {
            if(x+j>=histSizeX)
                dx = histSizeX-x-1;
            else
                dx = j;
            memcpy(featVect+(i*w+j)*hist[y+dy][x+dx].dim, hist[y+dy][x+dx].feat, sizeof(double)*hist[y+dy][x+dx].dim);
        }
    }
	//cout << "feature vector got" << endl;
}